

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void messageOut(TidyMessageImpl *message)

{
  Bool BVar1;
  TidyDocImpl *pTVar2;
  StreamOut *pSVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool local_4b;
  bool local_4a;
  byte *pbStack_30;
  byte b;
  ctmbstr cp;
  TidyOutputSink *outp;
  Bool go;
  TidyDocImpl *doc;
  TidyMessageImpl *message_local;
  
  if (message != (TidyMessageImpl *)0x0) {
    pTVar2 = message->tidyDoc;
    BVar1 = message->allowMessage;
    switch(message->level) {
    case TidyInfo:
      pTVar2->infoMessages = pTVar2->infoMessages + 1;
      break;
    case TidyWarning:
      pTVar2->warnings = pTVar2->warnings + 1;
      break;
    case TidyConfig:
      pTVar2->optionErrors = pTVar2->optionErrors + 1;
      break;
    case TidyAccess:
      pTVar2->accessErrors = pTVar2->accessErrors + 1;
      break;
    case TidyError:
      pTVar2->errors = pTVar2->errors + 1;
      break;
    case TidyBadDocument:
      pTVar2->docErrors = pTVar2->docErrors + 1;
      break;
    case TidyFatal:
    }
    outp._4_4_ = BVar1 & message->muted == no;
    if (message->level < TidyDialogueSummary) {
      outp._4_4_ = outp._4_4_ & (ulong)pTVar2->errors < (pTVar2->config).value[0x49].v;
    }
    if ((int)(pTVar2->config).value[0x44].v == 1) {
      bVar5 = false;
      if (outp._4_4_ != no) {
        bVar5 = message->code != 0x278;
      }
      bVar6 = false;
      if (bVar5) {
        bVar6 = message->code != 0x276;
      }
      bVar5 = false;
      if (bVar6) {
        bVar5 = message->code != 0x27b;
      }
      bVar6 = false;
      if (bVar5) {
        bVar6 = message->level != TidyDialogueInfo;
      }
      bVar5 = false;
      if (bVar6) {
        bVar5 = message->level != TidyConfig;
      }
      bVar6 = false;
      if (bVar5) {
        bVar6 = message->level != TidyInfo;
      }
      bVar4 = 0;
      if (bVar6) {
        bVar5 = false;
        if (TidyFatal < message->level) {
          bVar5 = message->code != 0x21c;
        }
        bVar4 = bVar5 ^ 1;
      }
      outp._4_4_ = (Bool)bVar4;
    }
    if ((int)(pTVar2->config).value[0x4b].v == 0) {
      bVar5 = false;
      if (outp._4_4_ != no) {
        bVar5 = message->level != TidyInfo;
      }
      local_4a = false;
      if (bVar5) {
        local_4a = message->level != TidyDialogueInfo;
      }
      outp._4_4_ = (Bool)local_4a;
    }
    if ((int)(pTVar2->config).value[0x4e].v == 0) {
      local_4b = false;
      if (outp._4_4_ != no) {
        local_4b = message->level != TidyWarning;
      }
      outp._4_4_ = (Bool)local_4b;
    }
    if (outp._4_4_ != no) {
      pSVar3 = pTVar2->errout;
      for (pbStack_30 = (byte *)message->messageOutput; *pbStack_30 != '\0';
          pbStack_30 = pbStack_30 + 1) {
        if (*pbStack_30 == '\n') {
          prvTidyWriteChar(10,pTVar2->errout);
        }
        else {
          (*(pSVar3->sink).putByte)((pSVar3->sink).sinkData,*pbStack_30);
        }
      }
      prvTidyWriteChar(10,pTVar2->errout);
    }
    prvTidytidyMessageRelease(message);
  }
  return;
}

Assistant:

static void messageOut( TidyMessageImpl *message )
{
    TidyDocImpl *doc;
    Bool go = yes;

    if ( !message )
        return;

    doc = message->tidyDoc;

    /* The filter has had a chance to suppress *any* message from output. */
    go = message->allowMessage;

    /* Update the count of each report type. */
    switch ( message->level )
    {
        case TidyInfo:
            doc->infoMessages++;
            break;
        case TidyWarning:
            doc->warnings++;
            break;
        case TidyConfig:
            doc->optionErrors++;
            break;
        case TidyAccess:
            doc->accessErrors++;
            break;
        case TidyError:
            doc->errors++;
            break;
        case TidyBadDocument:
            doc->docErrors++;
            break;
        case TidyFatal:
            /* Ack! */
            break;
        default:
            break;
    }

    /* Suppress report messages if they've been muted. */
    go = go & !message->muted;

    /* Suppress report messages if we've already reached the reporting limit. */
    if ( message->level <= TidyFatal )
    {
        go = go & ( doc->errors < cfg(doc, TidyShowErrors) );
    }

    /* Let TidyQuiet silence a lot of things. */
    if ( cfgBool( doc, TidyQuiet ) == yes )
    {
        go = go && message->code != STRING_DOCTYPE_GIVEN;
        go = go && message->code != STRING_CONTENT_LOOKS;
        go = go && message->code != STRING_NO_SYSID;
        go = go && message->level != TidyDialogueInfo;
        go = go && message->level != TidyConfig;
        go = go && message->level != TidyInfo;
        go = go && !(message->level >= TidyDialogueSummary &&
                            message->code != STRING_NEEDS_INTERVENTION);
    }

    /* Let !TidyShowInfo silence some things. */
    if ( cfgBool( doc, TidyShowInfo ) == no )
    {
        go = go && message->level != TidyInfo;

        /* Temporary; TidyShowInfo shouldn't affect TidyDialogueInfo, but
           right now such messages are hidden until we granularize the
           output controls. */
        go = go && message->level != TidyDialogueInfo;
    }

    /* Let !TidyShowWarnings silence some things. */
    if ( cfgBool( doc, TidyShowWarnings ) == no )
    {
        go = go && message->level != TidyWarning;
    }

    /* Output the message if applicable. */
    if ( go )
    {
        TidyOutputSink *outp = &doc->errout->sink;
        ctmbstr cp;
        byte b = '\0';
        for ( cp = message->messageOutput; *cp; ++cp )
        {
            b = (*cp & 0xff);
            if (b == (byte)'\n')
                TY_(WriteChar)( b, doc->errout );   /* for EOL translation */
            else
                outp->putByte( outp->sinkData, b ); /* #383 - no encoding */
        }

        /* Always add a trailing newline. Reports require this, and dialogue
           messages will be better spaced out without having to fill the
           language file with superflous newlines. */
        TY_(WriteChar)( '\n', doc->errout );
    }

    TY_(tidyMessageRelease)(message);
}